

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_user.cpp
# Opt level: O0

int AF_AActor_A_SkullPop
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  APlayerPawn *type;
  int iVar1;
  VMValue *pVVar2;
  PClass *p;
  bool bVar3;
  bool local_7f;
  int local_7c;
  undefined1 local_78 [4];
  int i;
  Self local_5c;
  WeaponInfo *local_58;
  player_t *player;
  APlayerPawn *mo;
  MetaClass *spawntype;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                  ,0x68d,
                  "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    spawntype = (MetaClass *)(param->field_0).field_1.a;
    local_7f = true;
    if (spawntype != (MetaClass *)0x0) {
      local_7f = DObject::IsKindOf((DObject *)spawntype,AActor::RegistrationInfo.MyClass);
    }
    if (local_7f == false) {
      __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                    ,0x68d,
                    "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    self._0_4_ = (int)self + 1;
    if ((int)self < ret_local._4_4_) {
      bVar3 = false;
      if (((char)defaultparam_local[(int)self].Count == '\x03') &&
         (bVar3 = true, defaultparam_local[(int)self].Most != 1)) {
        bVar3 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
      }
      if (!bVar3) {
        __assert_fail("(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                      ,0x68e,
                      "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      mo = (APlayerPawn *)defaultparam_local[(int)self].Array;
    }
    else {
      pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      bVar3 = false;
      if ((pVVar2->field_0).field_3.Type == '\x03') {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
        bVar3 = true;
        if ((pVVar2->field_0).field_1.atag != 1) {
          pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
          bVar3 = (pVVar2->field_0).field_1.a == (void *)0x0;
        }
      }
      if (!bVar3) {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                      ,0x68e,
                      "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar2 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      mo = (APlayerPawn *)(pVVar2->field_0).field_1.a;
    }
    if ((mo == (APlayerPawn *)0x0) ||
       (bVar3 = PClass::IsDescendantOf((PClass *)mo,APlayerChunk::RegistrationInfo.MyClass), !bVar3)
       ) {
      p = PClass::FindClass("BloodySkull");
      mo = (APlayerPawn *)dyn_cast<PClassPlayerPawn>((DObject *)p);
      if (mo == (APlayerPawn *)0x0) {
        return 0;
      }
    }
    operator~((EnumType)&local_5c);
    TFlags<ActorFlag,_unsigned_int>::operator&=
              ((TFlags<ActorFlag,_unsigned_int> *)
               ((long)&(spawntype->super_PClassActor).DropItems + 4),&local_5c);
    type = mo;
    AActor::PosPlusZ((DVector3 *)local_78,(AActor *)spawntype,48.0);
    player = (player_t *)Spawn((PClassActor *)type,(DVector3 *)local_78,NO_REPLACE);
    iVar1 = FRandom::Random2(&pr_skullpop);
    *(double *)&player->lastkilltime = (double)iVar1 / 128.0;
    iVar1 = FRandom::Random2(&pr_skullpop);
    player->ReadyWeapon = (AWeapon *)((double)iVar1 / 128.0);
    iVar1 = FRandom::operator()(&pr_skullpop);
    player->PendingWeapon = (AWeapon *)((double)iVar1 / 1024.0 + 2.0);
    local_58 = (WeaponInfo *)spawntype->Slot[4].Chars;
    spawntype->Slot[4].Chars = (char *)0x0;
    AActor::ObtainInventory((AActor *)player,(AActor *)spawntype);
    (player->weapons).Slots[5].Weapons.Array = local_58;
    (player->weapons).Slots[1].Weapons.Count = *(uint *)((long)&(spawntype->SoundClass).Chars + 4);
    TAngle<double>::operator=
              ((TAngle<double> *)(player->frags + 3),
               (TAngle<double> *)
               &(spawntype->super_PClassActor).super_PClass.super_PNativeStruct.super_PStruct.Fields
                .Most);
    if (local_58 != (WeaponInfo *)0x0) {
      local_58->Type = (PClassWeapon *)player;
      *(undefined4 *)((long)&local_58[0x10].Type + 4) = 0x20;
    }
    for (local_7c = 0; local_7c < 8; local_7c = local_7c + 1) {
      if (((playeringame[local_7c] & 1U) != 0) &&
         (bVar3 = TObjPtr<AActor>::operator==
                            ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)local_7c * 0x2a0),
                             (AActor *)spawntype), bVar3)) {
        TObjPtr<AActor>::operator=
                  ((TObjPtr<AActor> *)(&DAT_01ae7238 + (long)local_7c * 0x2a0),(AActor *)player);
      }
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_user.cpp"
                ,0x68d,
                "int AF_AActor_A_SkullPop(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SkullPop)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_CLASS_DEF(spawntype, APlayerChunk);

	APlayerPawn *mo;
	player_t *player;

	// [GRB] Parameterized version
	if (spawntype == NULL || !spawntype->IsDescendantOf(RUNTIME_CLASS(APlayerChunk)))
	{
		spawntype = dyn_cast<PClassPlayerPawn>(PClass::FindClass("BloodySkull"));
		if (spawntype == NULL)
			return 0;
	}

	self->flags &= ~MF_SOLID;
	mo = (APlayerPawn *)Spawn (spawntype, self->PosPlusZ(48.), NO_REPLACE);
	//mo->target = self;
	mo->Vel.X = pr_skullpop.Random2() / 128.;
	mo->Vel.Y = pr_skullpop.Random2() / 128.;
	mo->Vel.Z = 2. + (pr_skullpop() / 1024.);
	// Attach player mobj to bloody skull
	player = self->player;
	self->player = NULL;
	mo->ObtainInventory (self);
	mo->player = player;
	mo->health = self->health;
	mo->Angles.Yaw = self->Angles.Yaw;
	if (player != NULL)
	{
		player->mo = mo;
		player->damagecount = 32;
	}
	for (int i = 0; i < MAXPLAYERS; ++i)
	{
		if (playeringame[i] && players[i].camera == self)
		{
			players[i].camera = mo;
		}
	}
	return 0;
}